

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void FASTCOVER_tryParameters(void *opaque)

{
  ZDICT_cover_params_t *pZVar1;
  byte bVar2;
  FASTCOVER_ctx_t *ctx;
  size_t __size;
  ulong uVar3;
  ZDICT_cover_params_t parameters_00;
  COVER_dictSelection_t selection;
  ZDICT_cover_params_t params;
  ZDICT_cover_params_t parameters_01;
  void *__ptr;
  void *dictBuffer;
  U32 *freqs;
  size_t sVar4;
  BYTE *__ptr_00;
  size_t __size_00;
  ZDICT_cover_params_t parameters;
  COVER_dictSelection_t ds;
  undefined8 in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff68;
  COVER_dictSelection_t local_48;
  
  ctx = *opaque;
  pZVar1 = (ZDICT_cover_params_t *)((long)opaque + 0x18);
  uVar3._0_4_ = pZVar1->k;
  uVar3._4_4_ = pZVar1->d;
  parameters_01 = *pZVar1;
  params = *pZVar1;
  __size = *(size_t *)((long)opaque + 0x10);
  bVar2 = (byte)ctx->f;
  __ptr = calloc(1L << (bVar2 & 0x3f),2);
  dictBuffer = malloc(__size);
  local_48.dictContent = (BYTE *)0x0;
  local_48.dictSize = 0;
  local_48.totalCompressedSize = 0xffffffffffffffff;
  __size_00 = 4L << (bVar2 & 0x3f);
  freqs = (U32 *)malloc(__size_00);
  if ((dictBuffer == (void *)0x0 || __ptr == (void *)0x0) || freqs == (U32 *)0x0) {
    if (g_displayLevel < 1) {
      __ptr_00 = (BYTE *)0x0;
      goto LAB_0018b689;
    }
    FASTCOVER_tryParameters_cold_1();
    __ptr_00 = (BYTE *)0x0;
  }
  else {
    memcpy(freqs,ctx->freqs,__size_00);
    parameters_00.steps = (int)in_stack_ffffffffffffff20;
    parameters_00.nbThreads = (int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
    parameters_00._0_8_ = __ptr;
    parameters_00.splitPoint = (double)in_stack_ffffffffffffff28;
    parameters_00.shrinkDict = (int)in_stack_ffffffffffffff30;
    parameters_00.shrinkDictMaxRegression = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
    parameters_00.zParams.compressionLevel = (int)in_stack_ffffffffffffff38;
    parameters_00.zParams.notificationLevel = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    parameters_00._40_8_ = in_stack_ffffffffffffff40;
    sVar4 = FASTCOVER_buildDictionary
                      (ctx,freqs,dictBuffer,__size,parameters_00,(U16 *)(uVar3 & 0xffffffff));
    COVER_selectDict(&local_48,(BYTE *)((long)dictBuffer + sVar4),__size,__size - sVar4,ctx->samples
                     ,ctx->samplesSizes,
                     (uint)(((ulong)(ctx->accelParams).finalize * ctx->nbTrainSamples) / 100),
                     ctx->nbTrainSamples,ctx->nbSamples,params,ctx->offsets,
                     in_stack_ffffffffffffff68);
    __ptr_00 = local_48.dictContent;
    if ((local_48.dictContent != (BYTE *)0x0 && local_48.totalCompressedSize < 0xffffffffffffff89)
       || (g_displayLevel < 1)) goto LAB_0018b689;
    FASTCOVER_tryParameters_cold_2();
  }
  fflush(_stderr);
LAB_0018b689:
  free(dictBuffer);
  selection.dictSize = local_48.dictSize;
  selection.dictContent = local_48.dictContent;
  selection.totalCompressedSize = local_48.totalCompressedSize;
  COVER_best_finish(*(COVER_best_t **)((long)opaque + 8),parameters_01,selection);
  free(opaque);
  free(__ptr);
  free(__ptr_00);
  free(freqs);
  return;
}

Assistant:

static void FASTCOVER_tryParameters(void* opaque)
{
  /* Save parameters as local variables */
  FASTCOVER_tryParameters_data_t *const data = (FASTCOVER_tryParameters_data_t*)opaque;
  const FASTCOVER_ctx_t *const ctx = data->ctx;
  const ZDICT_cover_params_t parameters = data->parameters;
  size_t dictBufferCapacity = data->dictBufferCapacity;
  size_t totalCompressedSize = ERROR(GENERIC);
  /* Initialize array to keep track of frequency of dmer within activeSegment */
  U16* segmentFreqs = (U16*)calloc(((U64)1 << ctx->f), sizeof(U16));
  /* Allocate space for hash table, dict, and freqs */
  BYTE *const dict = (BYTE*)malloc(dictBufferCapacity);
  COVER_dictSelection_t selection = COVER_dictSelectionError(ERROR(GENERIC));
  U32* freqs = (U32*) malloc(((U64)1 << ctx->f) * sizeof(U32));
  if (!segmentFreqs || !dict || !freqs) {
    DISPLAYLEVEL(1, "Failed to allocate buffers: out of memory\n");
    goto _cleanup;
  }
  /* Copy the frequencies because we need to modify them */
  memcpy(freqs, ctx->freqs, ((U64)1 << ctx->f) * sizeof(U32));
  /* Build the dictionary */
  { const size_t tail = FASTCOVER_buildDictionary(ctx, freqs, dict, dictBufferCapacity,
                                                    parameters, segmentFreqs);

    const unsigned nbFinalizeSamples = (unsigned)(ctx->nbTrainSamples * ctx->accelParams.finalize / 100);
    selection = COVER_selectDict(dict + tail, dictBufferCapacity, dictBufferCapacity - tail,
         ctx->samples, ctx->samplesSizes, nbFinalizeSamples, ctx->nbTrainSamples, ctx->nbSamples, parameters, ctx->offsets,
         totalCompressedSize);

    if (COVER_dictSelectionIsError(selection)) {
      DISPLAYLEVEL(1, "Failed to select dictionary\n");
      goto _cleanup;
    }
  }
_cleanup:
  free(dict);
  COVER_best_finish(data->best, parameters, selection);
  free(data);
  free(segmentFreqs);
  COVER_dictSelectionFree(selection);
  free(freqs);
}